

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Team.cpp
# Opt level: O0

void __thiscall Team::Team(Team *this,string *name,Player *player1,Player *player2)

{
  Player *player2_local;
  Player *player1_local;
  string *name_local;
  Team *this_local;
  
  Serializable::Serializable(&this->super_Serializable);
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_serialize_abi_cxx11__001449e0;
  std::__cxx11::string::string((string *)&this->_name);
  std::__cxx11::list<Trick_*,_std::allocator<Trick_*>_>::list(&this->_tricksWon);
  std::__cxx11::string::assign((string *)&this->_name);
  (this->_players)._M_elems[0] = player1;
  (this->_players)._M_elems[1] = player2;
  Player::setTeam(player1,this);
  Player::setTeam(player2,this);
  this->_gameScore = 0;
  return;
}

Assistant:

Team::Team(string name, Player *player1, Player *player2) {
    _name.assign(name);
    _players = {player1, player2};
    player1->setTeam(this);
    player2->setTeam(this);
    _gameScore = 0;
}